

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter.h
# Opt level: O1

Context __thiscall
mp::
FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
::GetInitExprContext
          (FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
           *this,int var)

{
  pointer pCVar1;
  CtxVal CVar2;
  ulong uVar3;
  
  uVar3 = (ulong)var;
  pCVar1 = (this->var_info_).
           super__Vector_base<mp::ConstraintLocationHelper<mp::BasicConstraintKeeper>,_std::allocator<mp::ConstraintLocationHelper<mp::BasicConstraintKeeper>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (uVar3 < (ulong)((long)(this->var_info_).
                            super__Vector_base<mp::ConstraintLocationHelper<mp::BasicConstraintKeeper>,_std::allocator<mp::ConstraintLocationHelper<mp::BasicConstraintKeeper>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar1 >> 4)) {
    CVar2 = (*(pCVar1[uVar3].pck_)->_vptr_BasicConstraintKeeper[4])
                      (pCVar1[uVar3].pck_,(ulong)(uint)pCVar1[uVar3].index_);
    return (Context)CVar2;
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
}

Assistant:

const ConInfo& GetInitExpression(int var) const {
		return var_info_.at(var);
  }